

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-devurandom.c
# Opt level: O3

void uv__random_devurandom_init(void)

{
  char c;
  undefined1 local_1;
  
  status = uv__random_readpath("/dev/random",&local_1,1);
  return;
}

Assistant:

static void uv__random_devurandom_init(void) {
  char c;

  /* Linux's random(4) man page suggests applications should read at least
   * once from /dev/random before switching to /dev/urandom in order to seed
   * the system RNG. Reads from /dev/random can of course block indefinitely
   * until entropy is available but that's the point.
   */
  status = uv__random_readpath("/dev/random", &c, 1);
}